

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joystick.hpp
# Opt level: O0

void __thiscall Apple::II::JoystickPair::Joystick::Joystick(Joystick *this)

{
  initializer_list<Inputs::Joystick::Input> __l;
  allocator<Inputs::Joystick::Input> local_89;
  Input local_88;
  Input local_78;
  Input local_68;
  Input local_58;
  Input local_48;
  Input *local_38;
  size_type local_30;
  vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> local_28;
  Joystick *local_10;
  Joystick *this_local;
  
  local_10 = this;
  Inputs::Joystick::Input::Input(&local_88,Horizontal,0);
  Inputs::Joystick::Input::Input(&local_78,Vertical,0);
  Inputs::Joystick::Input::Input(&local_68,Fire,0);
  Inputs::Joystick::Input::Input(&local_58,Fire,1);
  Inputs::Joystick::Input::Input(&local_48,Fire,2);
  local_30 = 5;
  local_38 = &local_88;
  std::allocator<Inputs::Joystick::Input>::allocator(&local_89);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::vector
            (&local_28,__l,&local_89);
  Inputs::ConcreteJoystick::ConcreteJoystick(&this->super_ConcreteJoystick,&local_28);
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::~vector(&local_28)
  ;
  std::allocator<Inputs::Joystick::Input>::~allocator(&local_89);
  (this->super_ConcreteJoystick).super_Joystick._vptr_Joystick =
       (_func_int **)&PTR__Joystick_00c997a0;
  this->buttons[0] = false;
  this->buttons[1] = false;
  this->buttons[2] = false;
  this->axes[0] = 0.5;
  this->axes[1] = 0.5;
  return;
}

Assistant:

Joystick() :
					ConcreteJoystick({
						Input(Input::Horizontal),
						Input(Input::Vertical),

						// The Apple II offers three buttons between two joysticks;
						// this emulator puts three buttons on each joystick and
						// combines them.
						Input(Input::Fire, 0),
						Input(Input::Fire, 1),
						Input(Input::Fire, 2),
					}) {}